

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O1

dtime_t __thiscall duckdb::Interval::Add(Interval *this,dtime_t left,interval_t right,date_t *date)

{
  int iVar1;
  Interval *pIVar2;
  long lVar3;
  
  pIVar2 = this + right._0_8_ % 86400000000;
  if ((long)pIVar2 < 86400000000) {
    if (-1 < (long)pIVar2) {
      return (dtime_t)(int64_t)pIVar2;
    }
    lVar3 = 86400000000;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
    lVar3 = -86400000000;
  }
  *(int *)right.micros = *(int *)right.micros + iVar1;
  return (dtime_t)(int64_t)(pIVar2 + lVar3);
}

Assistant:

dtime_t Interval::Add(dtime_t left, interval_t right, date_t &date) {
	int64_t diff = right.micros - ((right.micros / Interval::MICROS_PER_DAY) * Interval::MICROS_PER_DAY);
	left += diff;
	if (left.micros >= Interval::MICROS_PER_DAY) {
		left.micros -= Interval::MICROS_PER_DAY;
		date.days++;
	} else if (left.micros < 0) {
		left.micros += Interval::MICROS_PER_DAY;
		date.days--;
	}
	return left;
}